

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool __thiscall JetHead::Path::append(Path *this,string *path)

{
  char *pcVar1;
  string *path_local;
  Path *this_local;
  
  std::__cxx11::string::length();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)this);
  if (*pcVar1 != '/') {
    std::__cxx11::string::append((ulong)this,'\x01');
  }
  std::__cxx11::string::append((string *)this);
  return true;
}

Assistant:

bool Path::append( const JHSTD::string &path )
{
	if ( mPath[ mPath.length() - 1 ] != PATH_SEPERATOR )
		mPath.append( 1, PATH_SEPERATOR	);
		
	mPath.append( path );
	return true;
}